

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeGPRwithAPSRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  long lVar2;
  
  if (RegNo == 0xf) {
    MCOperand_CreateReg0(Inst,2);
    DVar1 = MCDisassembler_Success;
  }
  else {
    if (RegNo < 0x10) {
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[RegNo]);
      lVar2 = 3;
    }
    else {
      lVar2 = 0;
    }
    DVar1 = (&DAT_001d6ad0)[lVar2];
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeGPRwithAPSRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (RegNo == 15) {
		MCOperand_CreateReg0(Inst, ARM_APSR_NZCV);
		return MCDisassembler_Success;
	}

	Check(&S, DecodeGPRRegisterClass(Inst, RegNo, Address, Decoder));
	return S;
}